

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
duckdb_fmt::v6::basic_memory_buffer<unsigned_int,_32UL,_std::allocator<unsigned_int>_>::grow
          (basic_memory_buffer<unsigned_int,_32UL,_std::allocator<unsigned_int>_> *this,size_t size)

{
  uint *__src;
  size_t sVar1;
  uint *__dest;
  ulong uVar2;
  
  __src = (this->super_buffer<unsigned_int>).ptr_;
  uVar2 = (this->super_buffer<unsigned_int>).capacity_;
  uVar2 = (uVar2 >> 1) + uVar2;
  if (uVar2 <= size) {
    uVar2 = size;
  }
  __dest = __gnu_cxx::new_allocator<unsigned_int>::allocate
                     ((new_allocator<unsigned_int> *)this,uVar2,(void *)0x0);
  sVar1 = (this->super_buffer<unsigned_int>).size_;
  if (sVar1 != 0) {
    memmove(__dest,__src,sVar1 << 2);
  }
  (this->super_buffer<unsigned_int>).ptr_ = __dest;
  (this->super_buffer<unsigned_int>).capacity_ = uVar2;
  if (__src != this->store_) {
    operator_delete(__src);
    return;
  }
  return;
}

Assistant:

void basic_memory_buffer<T, SIZE, Allocator>::grow(std::size_t size) {
#ifdef FUZZING_BUILD_MODE_UNSAFE_FOR_PRODUCTION
  if (size > 1000) throw std::runtime_error("fuzz mode - won't grow that much");
#endif
  std::size_t old_capacity = this->capacity();
  std::size_t new_capacity = old_capacity + old_capacity / 2;
  if (size > new_capacity) new_capacity = size;
  T* old_data = this->data();
  T* new_data = std::allocator_traits<Allocator>::allocate(*this, new_capacity);
  // The following code doesn't throw, so the raw pointer above doesn't leak.
  std::uninitialized_copy(old_data, old_data + this->size(),
                          internal::make_checked(new_data, new_capacity));
  this->set(new_data, new_capacity);
  // deallocate must not throw according to the standard, but even if it does,
  // the buffer already uses the new storage and will deallocate it in
  // destructor.
  if (old_data != store_) Allocator::deallocate(old_data, old_capacity);
}